

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O0

void __thiscall
Assimp::IRRImporter::BuildSkybox
          (IRRImporter *this,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *meshes,
          vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *materials)

{
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pvVar1;
  reference ppaVar2;
  size_type sVar3;
  reference ppaVar4;
  SkyboxVertex local_7e0;
  SkyboxVertex local_7bc;
  SkyboxVertex local_798;
  SkyboxVertex local_774;
  aiMesh *local_750;
  SkyboxVertex local_748;
  SkyboxVertex local_724;
  SkyboxVertex local_700;
  SkyboxVertex local_6dc;
  aiMesh *local_6b8;
  SkyboxVertex local_6b0;
  SkyboxVertex local_68c;
  SkyboxVertex local_668;
  SkyboxVertex local_644;
  aiMesh *local_620;
  SkyboxVertex local_618;
  SkyboxVertex local_5f4;
  SkyboxVertex local_5d0;
  SkyboxVertex local_5ac;
  aiMesh *local_588;
  SkyboxVertex local_580;
  SkyboxVertex local_55c;
  SkyboxVertex local_538;
  SkyboxVertex local_514;
  aiMesh *local_4f0;
  SkyboxVertex local_4e8;
  SkyboxVertex local_4c4;
  SkyboxVertex local_4a0;
  SkyboxVertex local_47c;
  aiMesh *local_458;
  undefined4 local_44c;
  int local_448;
  ai_real l;
  int shading;
  aiString s;
  __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
  local_38;
  aiMaterial *local_30;
  aiMaterial *out;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pvStack_20;
  uint i;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *materials_local;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *meshes_local;
  IRRImporter *this_local;
  
  pvStack_20 = materials;
  materials_local = (vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)meshes;
  meshes_local = (vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)this;
  for (out._4_4_ = 0; pvVar1 = materials_local, out._4_4_ < 6; out._4_4_ = out._4_4_ + 1) {
    s.data._1016_8_ = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::end(materials);
    local_38 = __gnu_cxx::
               __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
               ::operator-((__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                            *)(s.data + 0x3f8),(ulong)(6 - out._4_4_));
    ppaVar2 = __gnu_cxx::
              __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
              ::operator*(&local_38);
    local_30 = *ppaVar2;
    aiString::aiString((aiString *)&l);
    l = (ai_real)snprintf((char *)&shading,0x400,"SkyboxSide_%u",(ulong)out._4_4_);
    aiMaterial::AddProperty(local_30,(aiString *)&l,"?mat.name",0,0);
    local_448 = 9;
    aiMaterial::AddProperty(local_30,&local_448,1,"$mat.shadingm",0,0);
  }
  local_44c = 0x41200000;
  SkyboxVertex::SkyboxVertex(&local_47c,-10.0,-10.0,-10.0,0.0,0.0,1.0,1.0,1.0);
  SkyboxVertex::SkyboxVertex(&local_4a0,10.0,-10.0,-10.0,0.0,0.0,1.0,0.0,1.0);
  SkyboxVertex::SkyboxVertex(&local_4c4,10.0,10.0,-10.0,0.0,0.0,1.0,0.0,0.0);
  SkyboxVertex::SkyboxVertex(&local_4e8,-10.0,10.0,-10.0,0.0,0.0,1.0,1.0,0.0);
  local_458 = BuildSingleQuadMesh(this,&local_47c,&local_4a0,&local_4c4,&local_4e8);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)pvVar1,&local_458);
  sVar3 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(materials);
  ppaVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::back
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)materials_local);
  pvVar1 = materials_local;
  (*ppaVar4)->mMaterialIndex = (int)sVar3 - 6;
  SkyboxVertex::SkyboxVertex(&local_514,10.0,-10.0,-10.0,-1.0,0.0,0.0,1.0,1.0);
  SkyboxVertex::SkyboxVertex(&local_538,10.0,-10.0,10.0,-1.0,0.0,0.0,0.0,1.0);
  SkyboxVertex::SkyboxVertex(&local_55c,10.0,10.0,10.0,-1.0,0.0,0.0,0.0,0.0);
  SkyboxVertex::SkyboxVertex(&local_580,10.0,10.0,-10.0,-1.0,0.0,0.0,1.0,0.0);
  local_4f0 = BuildSingleQuadMesh(this,&local_514,&local_538,&local_55c,&local_580);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)pvVar1,&local_4f0);
  sVar3 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(materials);
  ppaVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::back
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)materials_local);
  pvVar1 = materials_local;
  (*ppaVar4)->mMaterialIndex = (int)sVar3 - 5;
  SkyboxVertex::SkyboxVertex(&local_5ac,10.0,-10.0,10.0,0.0,0.0,-1.0,1.0,1.0);
  SkyboxVertex::SkyboxVertex(&local_5d0,-10.0,-10.0,10.0,0.0,0.0,-1.0,0.0,1.0);
  SkyboxVertex::SkyboxVertex(&local_5f4,-10.0,10.0,10.0,0.0,0.0,-1.0,0.0,0.0);
  SkyboxVertex::SkyboxVertex(&local_618,10.0,10.0,10.0,0.0,0.0,-1.0,1.0,0.0);
  local_588 = BuildSingleQuadMesh(this,&local_5ac,&local_5d0,&local_5f4,&local_618);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)pvVar1,&local_588);
  sVar3 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(materials);
  ppaVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::back
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)materials_local);
  pvVar1 = materials_local;
  (*ppaVar4)->mMaterialIndex = (int)sVar3 - 4;
  SkyboxVertex::SkyboxVertex(&local_644,-10.0,-10.0,10.0,1.0,0.0,0.0,1.0,1.0);
  SkyboxVertex::SkyboxVertex(&local_668,-10.0,-10.0,-10.0,1.0,0.0,0.0,0.0,1.0);
  SkyboxVertex::SkyboxVertex(&local_68c,-10.0,10.0,-10.0,1.0,0.0,0.0,0.0,0.0);
  SkyboxVertex::SkyboxVertex(&local_6b0,-10.0,10.0,10.0,1.0,0.0,0.0,1.0,0.0);
  local_620 = BuildSingleQuadMesh(this,&local_644,&local_668,&local_68c,&local_6b0);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)pvVar1,&local_620);
  sVar3 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(materials);
  ppaVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::back
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)materials_local);
  pvVar1 = materials_local;
  (*ppaVar4)->mMaterialIndex = (int)sVar3 - 3;
  SkyboxVertex::SkyboxVertex(&local_6dc,10.0,10.0,-10.0,0.0,-1.0,0.0,1.0,1.0);
  SkyboxVertex::SkyboxVertex(&local_700,10.0,10.0,10.0,0.0,-1.0,0.0,0.0,1.0);
  SkyboxVertex::SkyboxVertex(&local_724,-10.0,10.0,10.0,0.0,-1.0,0.0,0.0,0.0);
  SkyboxVertex::SkyboxVertex(&local_748,-10.0,10.0,-10.0,0.0,-1.0,0.0,1.0,0.0);
  local_6b8 = BuildSingleQuadMesh(this,&local_6dc,&local_700,&local_724,&local_748);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)pvVar1,&local_6b8);
  sVar3 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(materials);
  ppaVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::back
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)materials_local);
  pvVar1 = materials_local;
  (*ppaVar4)->mMaterialIndex = (int)sVar3 - 2;
  SkyboxVertex::SkyboxVertex(&local_774,10.0,-10.0,10.0,0.0,1.0,0.0,0.0,0.0);
  SkyboxVertex::SkyboxVertex(&local_798,10.0,-10.0,-10.0,0.0,1.0,0.0,1.0,0.0);
  SkyboxVertex::SkyboxVertex(&local_7bc,-10.0,-10.0,-10.0,0.0,1.0,0.0,1.0,1.0);
  SkyboxVertex::SkyboxVertex(&local_7e0,-10.0,-10.0,10.0,0.0,1.0,0.0,0.0,1.0);
  local_750 = BuildSingleQuadMesh(this,&local_774,&local_798,&local_7bc,&local_7e0);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)pvVar1,&local_750);
  sVar3 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(materials);
  ppaVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::back
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)materials_local);
  (*ppaVar4)->mMaterialIndex = (int)sVar3 - 1;
  return;
}

Assistant:

void IRRImporter::BuildSkybox(std::vector<aiMesh*>& meshes, std::vector<aiMaterial*> materials)
{
    // Update the material of the skybox - replace the name and disable shading for skyboxes.
    for (unsigned int i = 0; i < 6;++i) {
        aiMaterial* out = ( aiMaterial* ) (*(materials.end()-(6-i)));

        aiString s;
        s.length = ::ai_snprintf( s.data, MAXLEN, "SkyboxSide_%u",i );
        out->AddProperty(&s,AI_MATKEY_NAME);

        int shading = aiShadingMode_NoShading;
        out->AddProperty(&shading,1,AI_MATKEY_SHADING_MODEL);
    }

    // Skyboxes are much more difficult. They are represented
    // by six single planes with different textures, so we'll
    // need to build six meshes.

    const ai_real l = 10.0; // the size used by Irrlicht

    // FRONT SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex(-l,-l,-l,  0, 0, 1,   1.0,1.0),
        SkyboxVertex( l,-l,-l,  0, 0, 1,   0.0,1.0),
        SkyboxVertex( l, l,-l,  0, 0, 1,   0.0,0.0),
        SkyboxVertex(-l, l,-l,  0, 0, 1,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-6u);

    // LEFT SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l,-l,-l,  -1, 0, 0,   1.0,1.0),
        SkyboxVertex( l,-l, l,  -1, 0, 0,   0.0,1.0),
        SkyboxVertex( l, l, l,  -1, 0, 0,   0.0,0.0),
        SkyboxVertex( l, l,-l,  -1, 0, 0,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-5u);

    // BACK SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l,-l, l,  0, 0, -1,   1.0,1.0),
        SkyboxVertex(-l,-l, l,  0, 0, -1,   0.0,1.0),
        SkyboxVertex(-l, l, l,  0, 0, -1,   0.0,0.0),
        SkyboxVertex( l, l, l,  0, 0, -1,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-4u);

    // RIGHT SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex(-l,-l, l,  1, 0, 0,   1.0,1.0),
        SkyboxVertex(-l,-l,-l,  1, 0, 0,   0.0,1.0),
        SkyboxVertex(-l, l,-l,  1, 0, 0,   0.0,0.0),
        SkyboxVertex(-l, l, l,  1, 0, 0,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-3u);

    // TOP SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l, l,-l,  0, -1, 0,   1.0,1.0),
        SkyboxVertex( l, l, l,  0, -1, 0,   0.0,1.0),
        SkyboxVertex(-l, l, l,  0, -1, 0,   0.0,0.0),
        SkyboxVertex(-l, l,-l,  0, -1, 0,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-2u);

    // BOTTOM SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l,-l, l,  0,  1, 0,   0.0,0.0),
        SkyboxVertex( l,-l,-l,  0,  1, 0,   1.0,0.0),
        SkyboxVertex(-l,-l,-l,  0,  1, 0,   1.0,1.0),
        SkyboxVertex(-l,-l, l,  0,  1, 0,   0.0,1.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-1u);
}